

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O0

void __thiscall FPlayerNameBox::Drawer(FPlayerNameBox *this,bool selected)

{
  char cVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  EColorRange local_4c;
  size_t l;
  char *pcStack_20;
  int x;
  char *text;
  bool selected_local;
  FPlayerNameBox *this_local;
  
  pcStack_20 = FString::operator_cast_to_char_(&this->mText);
  if (pcStack_20 != (char *)0x0) {
    if (*pcStack_20 == '$') {
      pcStack_20 = FStringTable::operator()(&GStrings,pcStack_20 + 1);
    }
    if (selected) {
      local_4c = OptionSettings.mFontColorSelection;
    }
    else {
      local_4c = this->mFontColor;
    }
    DCanvas::DrawText((DCanvas *)screen,this->mFont,local_4c,
                      (this->super_FListMenuItemSelectable).super_FListMenuItem.mXpos,
                      (this->super_FListMenuItemSelectable).super_FListMenuItem.mYpos,pcStack_20,
                      0x40001390,1,0);
  }
  iVar3 = (this->super_FListMenuItemSelectable).super_FListMenuItem.mXpos;
  iVar2 = FFont::StringWidth(this->mFont,pcStack_20);
  iVar3 = iVar3 + iVar2 + 0x10 + this->mFrameSize;
  DrawBorder(this,iVar3,
             (this->super_FListMenuItemSelectable).super_FListMenuItem.mYpos - this->mFrameSize,0x10
            );
  if ((this->mEntering & 1U) == 0) {
    DCanvas::DrawText((DCanvas *)screen,SmallFont,0xb,iVar3 + this->mFrameSize,
                      (this->super_FListMenuItemSelectable).super_FListMenuItem.mYpos,
                      this->mPlayerName,0x40001390,1,0);
  }
  else {
    sVar4 = strlen(this->mEditName);
    cVar1 = FFont::GetCursor(SmallFont);
    this->mEditName[sVar4] = cVar1;
    this->mEditName[sVar4 + 1] = '\0';
    DCanvas::DrawText((DCanvas *)screen,SmallFont,0xb,iVar3 + this->mFrameSize,
                      (this->super_FListMenuItemSelectable).super_FListMenuItem.mYpos,
                      this->mEditName,0x40001390,1,0);
    this->mEditName[sVar4] = '\0';
  }
  return;
}

Assistant:

void FPlayerNameBox::Drawer(bool selected)
{
	const char *text = mText;
	if (text != NULL)
	{
		if (*text == '$') text = GStrings(text+1);
		screen->DrawText(mFont, selected? OptionSettings.mFontColorSelection : mFontColor, mXpos, mYpos, text, DTA_Clean, true, TAG_DONE);
	}

	// Draw player name box
	int x = mXpos + mFont->StringWidth(text) + 16 + mFrameSize;
	DrawBorder (x, mYpos - mFrameSize, MAXPLAYERNAME+1);
	if (!mEntering)
	{
		screen->DrawText (SmallFont, CR_UNTRANSLATED, x + mFrameSize, mYpos, mPlayerName,
			DTA_Clean, true, TAG_DONE);
	}
	else
	{
		size_t l = strlen(mEditName);
		mEditName[l] = SmallFont->GetCursor();
		mEditName[l+1] = 0;

		screen->DrawText (SmallFont, CR_UNTRANSLATED, x + mFrameSize, mYpos, mEditName,
			DTA_Clean, true, TAG_DONE);
		
		mEditName[l] = 0;
	}
}